

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O2

int32_t zng_compress2(uchar *dest,size_t *destLen,uchar *source,size_t sourceLen,int level)

{
  int32_t iVar1;
  int32_t iVar2;
  ulong uVar3;
  ulong uVar4;
  zng_stream local_98;
  
  uVar4 = *destLen;
  *destLen = 0;
  local_98.zalloc = (alloc_func)0x0;
  local_98.zfree = (free_func)0x0;
  local_98.opaque = (void *)0x0;
  iVar1 = zng_deflateInit(&local_98,level);
  if (iVar1 == 0) {
    local_98.avail_out = 0;
    local_98.avail_in = 0;
    local_98.next_in = source;
    local_98.next_out = dest;
    do {
      if (local_98.avail_out == 0) {
        uVar3 = 0xffffffff;
        if (uVar4 < 0xffffffff) {
          uVar3 = uVar4;
        }
        local_98.avail_out = (uint32_t)uVar3;
        uVar4 = uVar4 - uVar3;
      }
      if (local_98.avail_in == 0) {
        uVar3 = 0xffffffff;
        if (sourceLen < 0xffffffff) {
          uVar3 = sourceLen;
        }
        local_98.avail_in = (uint32_t)uVar3;
        sourceLen = sourceLen - uVar3;
      }
      iVar2 = zng_deflate(&local_98,(uint)(sourceLen == 0) << 2);
    } while (iVar2 == 0);
    *destLen = local_98.total_out;
    zng_deflateEnd(&local_98);
    iVar1 = 0;
    if (iVar2 != 1) {
      iVar1 = iVar2;
    }
  }
  return iVar1;
}

Assistant:

int Z_EXPORT PREFIX(compress2)(unsigned char *dest, z_uintmax_t *destLen, const unsigned char *source,
                        z_uintmax_t sourceLen, int level) {
    PREFIX3(stream) stream;
    int err;
    const unsigned int max = (unsigned int)-1;
    z_size_t left;

    left = *destLen;
    *destLen = 0;

    stream.zalloc = NULL;
    stream.zfree = NULL;
    stream.opaque = NULL;

    err = PREFIX(deflateInit)(&stream, level);
    if (err != Z_OK)
        return err;

    stream.next_out = dest;
    stream.avail_out = 0;
    stream.next_in = (z_const unsigned char *)source;
    stream.avail_in = 0;

    do {
        if (stream.avail_out == 0) {
            stream.avail_out = left > (unsigned long)max ? max : (unsigned int)left;
            left -= stream.avail_out;
        }
        if (stream.avail_in == 0) {
            stream.avail_in = sourceLen > (unsigned long)max ? max : (unsigned int)sourceLen;
            sourceLen -= stream.avail_in;
        }
        err = PREFIX(deflate)(&stream, sourceLen ? Z_NO_FLUSH : Z_FINISH);
    } while (err == Z_OK);

    *destLen = stream.total_out;
    PREFIX(deflateEnd)(&stream);
    return err == Z_STREAM_END ? Z_OK : err;
}